

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector::
CycleDetector(soul::AST::Graph__(void *this,Graph *graph)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  pool_ref<soul::AST::ProcessorInstance> *p;
  pointer ppVar4;
  pool_ptr<soul::AST::ProcessorInstance> src;
  pool_ptr<soul::AST::ProcessorInstance> dst;
  undefined1 local_38 [8];
  ProcessorInstance *local_30;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)((long)this + 8) = 0;
  *(undefined8 *)((long)this + 0x10) = 0;
  std::
  vector<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node,_std::allocator<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node>_>
  ::reserve((vector<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node,_std::allocator<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node>_>
             *)this,(long)(graph->processorInstances).
                          super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(graph->processorInstances).
                          super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppVar1 = (graph->processorInstances).
           super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (graph->processorInstances).
                super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1) {
    heart::Utilities::
    GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
    ::addNode((GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
               *)this,ppVar4->object);
  }
  ppVar3 = (graph->connections).
           super__Vector_base<soul::pool_ref<soul::AST::Connection>,_std::allocator<soul::pool_ref<soul::AST::Connection>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (graph->connections).
           super__Vector_base<soul::pool_ref<soul::AST::Connection>,_std::allocator<soul::pool_ref<soul::AST::Connection>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar3 != ppVar2) {
    do {
      if ((((ppVar3->object->delayLength).object == (Expression *)0x0) &&
          (soul::AST::Connection::getProcessorInstance
                     ((Connection *)local_38,(ppVar3->object->source->endpoint).object),
          local_38 != (undefined1  [8])0x0)) &&
         (soul::AST::Connection::getProcessorInstance
                    ((Connection *)&stack0xffffffffffffffd0,(ppVar3->object->dest->endpoint).object)
         , local_30 != (ProcessorInstance *)0x0)) {
        if (local_38 == (undefined1  [8])0x0) {
          throwInternalCompilerError("object != nullptr","operator*",0x3b);
        }
        heart::Utilities::
        GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
        ::addConnection((GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
                         *)this,(ProcessorInstance *)local_38,local_30,ppVar3->object);
      }
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar2);
  }
  return;
}

Assistant:

CycleDetector (AST::Graph& graph)
                {
                    reserve (graph.processorInstances.size());

                    for (auto& p : graph.processorInstances)
                        addNode (p);

                    for (auto& c : graph.connections)
                        if (c->delayLength == nullptr)
                            if (auto src = c->getSourceProcessor())
                                if (auto dst = c->getDestProcessor())
                                    addConnection (*src, *dst, c);
                }